

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O1

void do_strike_of_virtue(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *victim;
  int iVar1;
  int iVar2;
  OBJ_DATA *arg1;
  char *txt;
  
  victim = ch->fighting;
  arg1 = get_eq_char(ch,0x10);
  if (ch->position == 7) {
    if (arg1 != (OBJ_DATA *)0x0) {
      iVar1 = get_skill(ch,(int)gsn_strike_of_virtue);
      iVar2 = number_percent();
      if ((double)iVar1 * 0.85 <= (double)iVar2) {
        act("You swing hard, but fail to connect with your opponent.",ch,(void *)0x0,(void *)0x0,3);
        damage(ch,victim,0,(int)gsn_strike_of_virtue,0,true);
      }
      else {
        act("$n brings $s $p around for a particularly brutal blow!",ch,arg1,(void *)0x0,0);
        act("You deliver a brutal blow to $N!",ch,(void *)0x0,victim,3);
        one_hit_new(ch,victim,(int)gsn_strike_of_virtue,true,false,0,0x7d,(char *)0x0);
      }
      check_improve(ch,(int)gsn_strike_of_virtue,(double)iVar2 < (double)iVar1 * 0.85,1);
      WAIT_STATE(ch,0x18);
      return;
    }
    txt = "You must be wielding a weapon.\n\r";
  }
  else {
    txt = "You must be fighting to perform this maneuver.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_strike_of_virtue(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *weapon;
	CHAR_DATA *victim = ch->fighting;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (ch->position != POS_FIGHTING)
	{
		send_to_char("You must be fighting to perform this maneuver.\n\r", ch);
		return;
	}

	if (weapon == nullptr)
	{
		send_to_char("You must be wielding a weapon.\n\r", ch);
		return;
	}

	if (get_skill(ch, gsn_strike_of_virtue) * .85 > number_percent())
	{
		act("$n brings $s $p around for a particularly brutal blow!", ch, weapon, 0, TO_ROOM);
		act("You deliver a brutal blow to $N!", ch, 0, victim, TO_CHAR);

		one_hit_new(ch, victim, gsn_strike_of_virtue, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 125, nullptr);
		check_improve(ch, gsn_strike_of_virtue, true, 1);
	}
	else
	{
		act("You swing hard, but fail to connect with your opponent.", ch, 0, 0, TO_CHAR);
		damage(ch, victim, 0, gsn_strike_of_virtue, DAM_NONE, true);
		check_improve(ch, gsn_strike_of_virtue, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}